

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O3

Matrix4x4 * __thiscall
CMU462::DynamicScene::Joint::getBindTransformation(Matrix4x4 *__return_storage_ptr__,Joint *this)

{
  long lVar1;
  Joint *pJVar2;
  Matrix4x4 *pMVar3;
  Matrix4x4 *pMVar4;
  byte bVar5;
  Vector3D local_168;
  Vector3D local_148;
  Matrix4x4 local_130;
  Matrix4x4 local_b0;
  
  bVar5 = 0;
  Matrix4x4::identity();
  pJVar2 = this->parent;
  if (pJVar2 != (Joint *)0x0) {
    do {
      local_168.x = (pJVar2->axis).x;
      local_168.y = (pJVar2->axis).y;
      local_168.z = (pJVar2->axis).z;
      Matrix4x4::translation(&local_168);
      Matrix4x4::operator*(&local_b0,&local_130,__return_storage_ptr__);
      pMVar3 = &local_b0;
      pMVar4 = __return_storage_ptr__;
      for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
        pMVar4->entries[0].x = pMVar3->entries[0].x;
        pMVar3 = (Matrix4x4 *)((long)pMVar3 + ((ulong)bVar5 * -2 + 1) * 8);
        pMVar4 = (Matrix4x4 *)((long)pMVar4 + ((ulong)bVar5 * -2 + 1) * 8);
      }
      pJVar2 = pJVar2->parent;
    } while (pJVar2 != (Joint *)0x0);
  }
  pJVar2 = this->skeleton->root;
  local_148.x = (pJVar2->super_SceneObject).position.x;
  local_148.y = (pJVar2->super_SceneObject).position.y;
  local_148.z = (pJVar2->super_SceneObject).position.z;
  Matrix4x4::translation(&local_148);
  Matrix4x4::operator*(&local_b0,&local_130,__return_storage_ptr__);
  pMVar3 = &local_b0;
  pMVar4 = __return_storage_ptr__;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pMVar4->entries[0].x = pMVar3->entries[0].x;
    pMVar3 = (Matrix4x4 *)((long)pMVar3 + ((ulong)bVar5 * -2 + 1) * 8);
    pMVar4 = (Matrix4x4 *)((long)pMVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Joint::getBindTransformation()
   {
     Matrix4x4 T = Matrix4x4::identity();
     for (Joint* j = parent; j != nullptr; j = j->parent)
     {
       T = Matrix4x4::translation(j->axis) * T;
     }

     // Allow skeleton translation by taking root's position into account
     T = Matrix4x4::translation(skeleton->root->position) * T;

     return T;
   }